

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t trap_order(wchar_t trap)

{
  trap_kind_conflict *ptVar1;
  _Bool _Var2;
  trap_kind_conflict *t;
  wchar_t trap_local;
  
  ptVar1 = trap_info;
  _Var2 = flag_has_dbg(trap_info[trap].flags,3,1,"t->flags","TRF_GLYPH");
  if (_Var2) {
    t._4_4_ = L'\0';
  }
  else {
    _Var2 = flag_has_dbg(ptVar1[trap].flags,3,0xd,"t->flags","TRF_LOCK");
    if (_Var2) {
      t._4_4_ = L'\x01';
    }
    else {
      _Var2 = flag_has_dbg(ptVar1[trap].flags,3,2,"t->flags","TRF_TRAP");
      if (_Var2) {
        t._4_4_ = L'\x02';
      }
      else {
        _Var2 = flag_has_dbg(ptVar1[trap].flags,3,0x10,"t->flags","TRF_M_TRAP");
        if (_Var2) {
          t._4_4_ = L'\x03';
        }
        else {
          t._4_4_ = L'\x04';
        }
      }
    }
  }
  return t._4_4_;
}

Assistant:

static int trap_order(int trap)
{
	const struct trap_kind *t = &trap_info[trap];

	if (trf_has(t->flags, TRF_GLYPH))
		return 0;
	else if (trf_has(t->flags, TRF_LOCK))
		return 1;
	else if (trf_has(t->flags, TRF_TRAP))
		return 2;
	else if (trf_has(t->flags, TRF_M_TRAP))
		return 3;
	else
		return 4;
}